

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.c
# Opt level: O1

BOOL is_member_of_set(unsigned_short n,List *set)

{
  TokenType TVar1;
  int iVar2;
  BOOL BVar3;
  char *pcVar4;
  uint uVar5;
  List *pLVar6;
  bool bVar7;
  char buf [512];
  char acStack_218 [512];
  
  TVar1 = (set->token).type;
  if (TVar1 != TOK_LIST) {
    if (TVar1 != TOK_QUOTED_STRING) {
      pcVar4 = unparse_token(&set->token,acStack_218);
      parse_error(set,
                  "Malformed bit set; expecting quoted string of bits, union, intersect, or not, found %s\n"
                  ,pcVar4);
      return FALSE;
    }
    pcVar4 = (set->token).u.string;
    uVar5 = 0x8000;
    do {
      if (*pcVar4 == '1') {
        if ((uVar5 & n) == 0) {
          return FALSE;
        }
      }
      else if ((*pcVar4 == '0') && ((uVar5 & n) != 0)) {
        return FALSE;
      }
      pcVar4 = pcVar4 + 1;
      bVar7 = uVar5 < 2;
      uVar5 = uVar5 >> 1;
      if (bVar7) {
        return TRUE;
      }
    } while( true );
  }
  pLVar6 = set->car;
  if (pLVar6 == (List *)0x0) {
    return FALSE;
  }
  TVar1 = (pLVar6->token).type;
  if (TVar1 == TOK_NOT) {
    iVar2 = list_length(pLVar6);
    set = set->car;
    if (iVar2 == 2) {
      BVar3 = is_member_of_set(n,set->cdr);
      return BVar3 ^ TRUE;
    }
    pcVar4 = "Must have exactly one argument to not.\n";
  }
  else {
    if (TVar1 == TOK_INTERSECT) {
      iVar2 = list_length(pLVar6);
      if (iVar2 < 2) {
        parse_error(set->car,"Missing arguments to intersect.\n");
      }
      pLVar6 = set->car;
      do {
        pLVar6 = pLVar6->cdr;
        if (pLVar6 == (List *)0x0) {
          return TRUE;
        }
        BVar3 = is_member_of_set(n,pLVar6);
      } while (BVar3 != FALSE);
      return FALSE;
    }
    if (TVar1 == TOK_UNION) {
      iVar2 = list_length(pLVar6);
      if (iVar2 < 2) {
        parse_error(set->car,"Missing arguments to union.\n");
      }
      pLVar6 = set->car;
      do {
        pLVar6 = pLVar6->cdr;
        if (pLVar6 == (List *)0x0) {
          return FALSE;
        }
        BVar3 = is_member_of_set(n,pLVar6);
      } while (BVar3 == FALSE);
      return TRUE;
    }
    pcVar4 = "Malformed bit set; expecting quoted string of bits, union, intersect, or not.\n";
  }
  parse_error(set,pcVar4);
  return FALSE;
}

Assistant:

BOOL
is_member_of_set (unsigned short n, List *set)
{
  List *tmp;
  char buf[512];

  /* If we are looking for a match against a quoted string, efficiently
   * determine if all of the literal bits match.  This could be vastly
   * faster if the quoted string were replaced with a mask of bits that must
   * be valid and a set of values for those bits, but speed just doesn't
   * matter here, and it's handy to deal with the original string (which
   * can contain other information via the specific choice of non-'0'
   * and non-'1' characters).
   */
  if (set->token.type == TOK_QUOTED_STRING)
    {
      const char *s = set->token.u.string;
      int mask;


      for (mask = 1 << 15; mask != 0; s++, mask >>= 1)
	if ((*s == '0' && (n & mask)) || (*s == '1' && !(n & mask)))
	  {
	    return FALSE;
	  }

      return TRUE;
    }

  if (set->token.type != TOK_LIST)
    {
      /* This error will get printed a zillion times, but who cares. */
      parse_error (set, "Malformed bit set; expecting quoted string of bits, "
		   "union, intersect, or not, found %s\n",
		   unparse_token (&set->token, buf));
      return FALSE;
    }

  /* Not a member of the empty list. */
  if (set->car == NULL)
    return FALSE;

  /* See what type of operation we are performing, and do the appropriate
   * thing.
   */
  switch (set->car->token.type) {
  case TOK_UNION:
    if (list_length (set->car) < 2)
      parse_error (set->car, "Missing arguments to union.\n");
    for (tmp = CDAR (set); tmp != NULL; tmp = tmp->cdr)
      if (is_member_of_set (n, tmp))
	return TRUE;
    return FALSE;
  case TOK_INTERSECT:
    if (list_length (set->car) < 2)
      parse_error (set->car, "Missing arguments to intersect.\n");
    for (tmp = CDAR (set); tmp != NULL; tmp = tmp->cdr)
      if (!is_member_of_set (n, tmp))
	return FALSE;
    return TRUE;
  case TOK_NOT:
    if (list_length (set->car) != 2)
      {
	parse_error (set->car, "Must have exactly one argument to not.\n");
	return FALSE;
      }
    return !is_member_of_set (n, CDAR (set));
  default:
    /* This error will get printed a zillion times, but who cares. */
    parse_error (set, "Malformed bit set; expecting quoted string of bits, "
		 "union, intersect, or not.\n");
    return FALSE;
  }
}